

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_next.c
# Opt level: O1

int NeXTDecode(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  long c;
  uint32_t *puVar4;
  uint uVar5;
  byte *pbVar6;
  int iVar7;
  byte *s_00;
  long lVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  
  if (0 < occ) {
    memset(buf,0xff,occ);
  }
  c = tif->tif_scanlinesize;
  if (occ % c == 0) {
    s_00 = tif->tif_rawcp;
    lVar12 = tif->tif_rawcc;
    if (0 < occ && 0 < lVar12) {
      pbVar6 = s_00;
      do {
        s_00 = pbVar6 + 1;
        bVar2 = *pbVar6;
        lVar1 = lVar12 + -1;
        if (bVar2 == 0x40) {
          if (lVar12 < 5) {
            bVar13 = false;
            lVar12 = lVar1;
          }
          else {
            uVar11 = (ulong)(ushort)(*(ushort *)(pbVar6 + 3) << 8 | *(ushort *)(pbVar6 + 3) >> 8);
            lVar8 = uVar11 + 4;
            bVar13 = false;
            bVar14 = lVar8 < lVar12;
            lVar12 = lVar1;
            if ((bVar14) &&
               (uVar9 = (ulong)(ushort)(*(ushort *)(pbVar6 + 1) << 8 | *(ushort *)(pbVar6 + 1) >> 8)
               , (long)(uVar11 + uVar9) <= c)) {
              _TIFFmemcpy(buf + uVar9,pbVar6 + 5,uVar11);
              s_00 = s_00 + lVar8;
              lVar12 = lVar1 - lVar8;
              bVar13 = true;
            }
          }
          if (!bVar13) goto LAB_002af4c4;
        }
        else if (bVar2 == 0) {
          if (lVar12 <= c) {
LAB_002af4c4:
            TIFFErrorExtR(tif,"NeXTDecode","Not enough data for scanline %u",(ulong)tif->tif_row);
            return 0;
          }
          _TIFFmemcpy(buf,s_00,c);
          s_00 = s_00 + c;
          lVar12 = lVar1 - c;
        }
        else {
          puVar4 = &(tif->tif_dir).td_imagewidth;
          if ((tif->tif_flags & 0x400) != 0) {
            puVar4 = &(tif->tif_dir).td_tilewidth;
          }
          uVar3 = *puVar4;
          uVar5 = 0;
          lVar8 = 0;
          pbVar6 = buf;
          lVar12 = lVar1;
          while( true ) {
            bVar13 = uVar5 < uVar3;
            bVar14 = lVar8 < c;
            if ((((bVar2 & 0x3f) != 0) && (uVar5 < uVar3)) && (lVar8 < c)) {
              bVar10 = bVar2 >> 6;
              uVar11 = (ulong)(bVar2 & 0x3f);
              do {
                switch(uVar5 & 3) {
                case 0:
                  *pbVar6 = bVar2 & 0xc0;
                  break;
                case 1:
                  *pbVar6 = *pbVar6 | bVar10 << 4;
                  break;
                case 2:
                  *pbVar6 = *pbVar6 | bVar10 * '\x04';
                  break;
                case 3:
                  *pbVar6 = *pbVar6 | bVar10;
                  pbVar6 = pbVar6 + 1;
                  lVar8 = lVar8 + 1;
                }
                uVar5 = uVar5 + 1;
                bVar13 = uVar5 < uVar3;
                bVar14 = lVar8 < c;
              } while (((1 < (long)uVar11) && (uVar5 < uVar3)) && (uVar11 = uVar11 - 1, lVar8 < c));
            }
            if (!bVar13) {
              iVar7 = 7;
              goto LAB_002af47f;
            }
            if (!bVar14) {
              TIFFErrorExtR(tif,"NeXTDecode","Invalid data for scanline %u",(ulong)tif->tif_row);
              iVar7 = 1;
              goto LAB_002af47f;
            }
            bVar14 = lVar12 == 0;
            lVar12 = lVar12 + -1;
            if (bVar14) break;
            bVar2 = *s_00;
            s_00 = s_00 + 1;
          }
          iVar7 = 8;
          lVar12 = 0;
LAB_002af47f:
          if (iVar7 != 7) {
            if (iVar7 != 8) {
              return 0;
            }
            goto LAB_002af4c4;
          }
        }
        if (lVar12 < 1) break;
        occ = occ - c;
        buf = buf + c;
        pbVar6 = s_00;
      } while (0 < occ);
    }
    tif->tif_rawcp = s_00;
    tif->tif_rawcc = lVar12;
    iVar7 = 1;
  }
  else {
    iVar7 = 0;
    TIFFErrorExtR(tif,"NeXTDecode","Fractional scanlines cannot be read");
  }
  return iVar7;
}

Assistant:

static int NeXTDecode(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    static const char module[] = "NeXTDecode";
    unsigned char *bp, *op;
    tmsize_t cc;
    uint8_t *row;
    tmsize_t scanline, n;

    (void)s;
    /*
     * Each scanline is assumed to start off as all
     * white (we assume a PhotometricInterpretation
     * of ``min-is-black'').
     */
    for (op = (unsigned char *)buf, cc = occ; cc-- > 0;)
        *op++ = 0xff;

    bp = (unsigned char *)tif->tif_rawcp;
    cc = tif->tif_rawcc;
    scanline = tif->tif_scanlinesize;
    if (occ % scanline)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (0);
    }
    for (row = buf; cc > 0 && occ > 0; occ -= scanline, row += scanline)
    {
        n = *bp++;
        cc--;
        switch (n)
        {
            case LITERALROW:
                /*
                 * The entire scanline is given as literal values.
                 */
                if (cc < scanline)
                    goto bad;
                _TIFFmemcpy(row, bp, scanline);
                bp += scanline;
                cc -= scanline;
                break;
            case LITERALSPAN:
            {
                tmsize_t off;
                /*
                 * The scanline has a literal span that begins at some
                 * offset.
                 */
                if (cc < 4)
                    goto bad;
                off = (bp[0] * 256) + bp[1];
                n = (bp[2] * 256) + bp[3];
                if (cc < 4 + n || off + n > scanline)
                    goto bad;
                _TIFFmemcpy(row + off, bp + 4, n);
                bp += 4 + n;
                cc -= 4 + n;
                break;
            }
            default:
            {
                uint32_t npixels = 0, grey;
                tmsize_t op_offset = 0;
                uint32_t imagewidth = tif->tif_dir.td_imagewidth;
                if (isTiled(tif))
                    imagewidth = tif->tif_dir.td_tilewidth;

                /*
                 * The scanline is composed of a sequence of constant
                 * color ``runs''.  We shift into ``run mode'' and
                 * interpret bytes as codes of the form
                 * <color><npixels> until we've filled the scanline.
                 */
                op = row;
                for (;;)
                {
                    grey = (uint32_t)((n >> 6) & 0x3);
                    n &= 0x3f;
                    /*
                     * Ensure the run does not exceed the scanline
                     * bounds, potentially resulting in a security
                     * issue.
                     */
                    while (n-- > 0 && npixels < imagewidth &&
                           op_offset < scanline)
                        SETPIXEL(op, grey);
                    if (npixels >= imagewidth)
                        break;
                    if (op_offset >= scanline)
                    {
                        TIFFErrorExtR(tif, module,
                                      "Invalid data for scanline %" PRIu32,
                                      tif->tif_row);
                        return (0);
                    }
                    if (cc == 0)
                        goto bad;
                    n = *bp++;
                    cc--;
                }
                break;
            }
        }
    }
    tif->tif_rawcp = (uint8_t *)bp;
    tif->tif_rawcc = cc;
    return (1);
bad:
    TIFFErrorExtR(tif, module, "Not enough data for scanline %" PRIu32,
                  tif->tif_row);
    return (0);
}